

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTargetInternals::ComputeLinkInterface
          (cmTargetInternals *this,cmTarget *thisTarget,string *config,OptionalLinkInterface *iface,
          cmTarget *headTarget)

{
  cmTarget *pcVar1;
  PolicyStatus PVar2;
  LinkImplementationLibraries *pLVar3;
  LinkImplementation *pLVar4;
  char *pcVar5;
  pointer __x;
  pointer __obj;
  string propName;
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  emitted;
  allocator local_a1;
  string *local_a0;
  string local_98;
  hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  local_78;
  string local_50;
  
  local_a0 = config;
  if (iface->ExplicitLibraries == (char *)0x0) {
    PVar2 = cmTarget::GetPolicyStatusCMP0022(thisTarget);
    if ((PVar2 == WARN) || (PVar2 = cmTarget::GetPolicyStatusCMP0022(thisTarget), PVar2 == OLD)) {
      pLVar3 = cmTarget::GetLinkImplementationLibrariesInternal(thisTarget,local_a0,headTarget);
      (iface->super_LinkInterface).ImplementationIsInterface = true;
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::operator=
                (&(iface->super_LinkInterface).WrongConfigLibraries,&pLVar3->WrongConfigLibraries);
    }
  }
  else if ((thisTarget->TargetTypeValue < UNKNOWN_LIBRARY) &&
          ((0x86U >> (thisTarget->TargetTypeValue & 0x1f) & 1) != 0)) {
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::hash_set((hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                *)&local_78);
    for (__obj = (iface->super_LinkInterface).super_LinkInterfaceLibraries.Libraries.
                 super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                 super__Vector_impl_data._M_start;
        __obj != (iface->super_LinkInterface).super_LinkInterfaceLibraries.Libraries.
                 super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                 super__Vector_impl_data._M_finish; __obj = __obj + 1) {
      cmsys::
      hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                *)&local_98,
               (hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                *)&local_78,&__obj->super_string);
    }
    if (thisTarget->TargetTypeValue != INTERFACE_LIBRARY) {
      pLVar4 = cmTarget::GetLinkImplementation(thisTarget,local_a0);
      for (__x = (pLVar4->super_LinkImplementationLibraries).Libraries.
                 super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                 super__Vector_impl_data._M_start;
          __x != (pLVar4->super_LinkImplementationLibraries).Libraries.
                 super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                 super__Vector_impl_data._M_finish; __x = __x + 1) {
        cmsys::
        hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
        ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                  *)&local_98,
                 (hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                  *)&local_78,(value_type *)__x);
        if (((local_98.field_2._M_local_buf[0] == '\x01') &&
            (pcVar1 = (__x->super_cmLinkItem).Target, pcVar1 != (cmTarget *)0x0)) &&
           (pcVar1->TargetTypeValue == SHARED_LIBRARY)) {
          std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::push_back
                    (&(iface->super_LinkInterface).SharedDeps,&__x->super_cmLinkItem);
        }
      }
    }
    cmsys::
    hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::~hashtable(&local_78);
  }
  if (thisTarget->TargetTypeValue != STATIC_LIBRARY) {
    return;
  }
  pLVar4 = cmTarget::GetLinkImplementation(thisTarget,local_a0);
  if (pLVar4 != (LinkImplementation *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(iface->super_LinkInterface).Languages,&pLVar4->Languages);
  }
  if (thisTarget->TargetTypeValue != STATIC_LIBRARY) {
    return;
  }
  std::__cxx11::string::string((string *)&local_78,"_",(allocator *)&local_98);
  if (local_a0->_M_string_length == 0) {
    std::__cxx11::string::append((char *)&local_78);
  }
  else {
    cmsys::SystemTools::UpperCase(&local_98,local_a0);
    std::__cxx11::string::append((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
  }
  std::__cxx11::string::string
            ((string *)&local_98,"LINK_INTERFACE_MULTIPLICITY",(allocator *)&local_50);
  std::__cxx11::string::append((string *)&local_98);
  pcVar5 = cmTarget::GetProperty(thisTarget,&local_98);
  if (pcVar5 == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_50,"LINK_INTERFACE_MULTIPLICITY",&local_a1);
    pcVar5 = cmTarget::GetProperty(thisTarget,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (pcVar5 == (char *)0x0) goto LAB_0031f86a;
  }
  __isoc99_sscanf(pcVar5,"%u",&(iface->super_LinkInterface).Multiplicity);
LAB_0031f86a:
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void cmTargetInternals::ComputeLinkInterface(cmTarget const* thisTarget,
                                             const std::string& config,
                                             OptionalLinkInterface& iface,
                                             cmTarget const* headTarget) const
{
  if(iface.ExplicitLibraries)
    {
    if(thisTarget->GetType() == cmTarget::SHARED_LIBRARY
        || thisTarget->GetType() == cmTarget::STATIC_LIBRARY
        || thisTarget->GetType() == cmTarget::INTERFACE_LIBRARY)
      {
      // Shared libraries may have runtime implementation dependencies
      // on other shared libraries that are not in the interface.
      UNORDERED_SET<std::string> emitted;
      for(std::vector<cmLinkItem>::const_iterator
          li = iface.Libraries.begin(); li != iface.Libraries.end(); ++li)
        {
        emitted.insert(*li);
        }
      if (thisTarget->GetType() != cmTarget::INTERFACE_LIBRARY)
        {
        cmTarget::LinkImplementation const* impl =
            thisTarget->GetLinkImplementation(config);
        for(std::vector<cmLinkImplItem>::const_iterator
              li = impl->Libraries.begin(); li != impl->Libraries.end(); ++li)
          {
          if(emitted.insert(*li).second)
            {
            if(li->Target)
              {
              // This is a runtime dependency on another shared library.
              if(li->Target->GetType() == cmTarget::SHARED_LIBRARY)
                {
                iface.SharedDeps.push_back(*li);
                }
              }
            else
              {
              // TODO: Recognize shared library file names.  Perhaps this
              // should be moved to cmComputeLinkInformation, but that creates
              // a chicken-and-egg problem since this list is needed for its
              // construction.
              }
            }
          }
        }
      }
    }
  else if (thisTarget->GetPolicyStatusCMP0022() == cmPolicies::WARN
        || thisTarget->GetPolicyStatusCMP0022() == cmPolicies::OLD)
    {
    // The link implementation is the default link interface.
    cmTarget::LinkImplementationLibraries const*
      impl = thisTarget->GetLinkImplementationLibrariesInternal(config,
                                                                headTarget);
    iface.ImplementationIsInterface = true;
    iface.WrongConfigLibraries = impl->WrongConfigLibraries;
    }

  if(thisTarget->LinkLanguagePropagatesToDependents())
    {
    // Targets using this archive need its language runtime libraries.
    if(cmTarget::LinkImplementation const* impl =
       thisTarget->GetLinkImplementation(config))
      {
      iface.Languages = impl->Languages;
      }
    }

  if(thisTarget->GetType() == cmTarget::STATIC_LIBRARY)
    {
    // Construct the property name suffix for this configuration.
    std::string suffix = "_";
    if(!config.empty())
      {
      suffix += cmSystemTools::UpperCase(config);
      }
    else
      {
      suffix += "NOCONFIG";
      }

    // How many repetitions are needed if this library has cyclic
    // dependencies?
    std::string propName = "LINK_INTERFACE_MULTIPLICITY";
    propName += suffix;
    if(const char* config_reps = thisTarget->GetProperty(propName))
      {
      sscanf(config_reps, "%u", &iface.Multiplicity);
      }
    else if(const char* reps =
            thisTarget->GetProperty("LINK_INTERFACE_MULTIPLICITY"))
      {
      sscanf(reps, "%u", &iface.Multiplicity);
      }
    }
}